

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.cpp
# Opt level: O2

byte * __thiscall
slang::BumpAllocator::allocateSlow(BumpAllocator *this,size_t size,size_t alignment)

{
  Segment *pSVar1;
  byte *pbVar2;
  
  if (0x800 < size) {
    pSVar1 = allocSegment(this->head->prev,((alignment + size) - 1 & -alignment) + 0x10);
    this->head->prev = pSVar1;
    return (byte *)((ulong)(pSVar1->current + (alignment - 1)) & -alignment);
  }
  pSVar1 = allocSegment(this->head,0x1000);
  this->head = pSVar1;
  this->endPtr = (byte *)(pSVar1 + 0x100);
  pbVar2 = allocate(this,size,alignment);
  return pbVar2;
}

Assistant:

byte* BumpAllocator::allocateSlow(size_t size, size_t alignment) {
    // for really large allocations, give them their own segment
    if (size > (SEGMENT_SIZE >> 1)) {
        size = (size + alignment - 1) & ~(alignment - 1);
        head->prev = allocSegment(head->prev, size + sizeof(Segment));
        return alignPtr(head->prev->current, alignment);
    }

    // otherwise, start a new block
    head = allocSegment(head, SEGMENT_SIZE);
    endPtr = (byte*)head + SEGMENT_SIZE;
    return allocate(size, alignment);
}